

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char cVar4;
  int iVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  float *pfVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  undefined1 uVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  uchar scanlineheader [4];
  char header [66];
  char buffer [128];
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  char local_19a;
  char local_199;
  float local_198;
  undefined4 local_194;
  void *local_190;
  void *local_188;
  long local_180;
  ulong local_178;
  uint local_16c;
  uint local_168;
  int local_164;
  uint local_160;
  uint local_15c;
  char local_158 [4];
  char local_154 [4];
  void *local_150;
  long local_148;
  ulong local_140;
  float *local_138;
  ulong local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  char local_108 [64];
  undefined2 local_c8;
  char local_b8 [136];
  
  iVar5 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    uVar12 = (ulong)(uint)x;
    local_138 = data;
    local_150 = malloc((ulong)(uint)(x * 4));
    local_c8 = 10;
    builtin_strncpy(local_108,"#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe",
                    0x40);
    (*s->func)(s->context,local_108,0x41);
    iVar5 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    uVar10 = 0;
    (*s->func)(s->context,local_b8,iVar5);
    local_164 = comp * x;
    local_16c = x - 0x8000;
    local_168 = (uint)x >> 8;
    uVar13 = comp - 3;
    local_148 = (long)comp << 2;
    local_118 = (ulong)(uint)(x * 2) + (long)local_150;
    local_120 = (long)local_150 + uVar12;
    local_110 = (ulong)(uint)(x * 3) + (long)local_150;
    local_128 = -uVar12;
    pvVar16 = local_150;
    local_178 = (ulong)(uint)x;
    local_160 = y;
    local_15c = uVar13;
    local_140 = uVar12;
    do {
      uVar9 = ~(uint)uVar10 + local_160;
      if (stbi__flip_vertically_on_write == 0) {
        uVar9 = (uint)uVar10;
      }
      pfVar11 = local_138 + (int)(uVar9 * local_164);
      local_194 = CONCAT13((char)local_178,CONCAT12((char)local_168,0x202));
      uVar18 = uVar12;
      local_130 = uVar10;
      if (local_16c < 0xffff8008) {
        do {
          if (uVar13 < 2) {
            fVar20 = pfVar11[2];
            auVar21 = ZEXT416((uint)pfVar11[1]);
            auVar22 = ZEXT416((uint)*pfVar11);
          }
          else {
            fVar20 = *pfVar11;
            auVar21 = ZEXT416((uint)fVar20);
            auVar22 = auVar21;
          }
          auVar2 = vmaxss_avx(auVar21,ZEXT416((uint)fVar20));
          auVar2 = vmaxss_avx(auVar22,auVar2);
          fVar23 = auVar2._0_4_;
          if (1e-32 <= fVar23) {
            local_188 = (void *)CONCAT44(local_188._4_4_,fVar20);
            local_190 = (void *)CONCAT44(local_190._4_4_,auVar21._0_4_);
            local_180 = CONCAT44(local_180._4_4_,auVar22._0_4_);
            local_198 = fVar23;
            fVar20 = frexpf(fVar23,(int *)local_158);
            fVar20 = (fVar20 * 256.0) / local_198;
            local_19a = local_158[0] + -0x80;
            local_19d = (undefined1)(int)(fVar20 * (float)local_180);
            local_19c = (undefined1)(int)(fVar20 * local_190._0_4_);
            local_19b = (undefined1)(int)(fVar20 * local_188._0_4_);
          }
          else {
            local_19c = 0;
            local_19d = 0;
            local_19a = '\0';
            local_19b = 0;
          }
          (*s->func)(s->context,&local_19d,4);
          pfVar11 = (float *)((long)pfVar11 + local_148);
          uVar18 = uVar18 - 1;
          pvVar17 = pvVar16;
        } while (uVar18 != 0);
      }
      else {
        lVar19 = 0;
        do {
          if (uVar13 < 2) {
            fVar20 = pfVar11[2];
            auVar21 = ZEXT416((uint)pfVar11[1]);
            auVar22 = ZEXT416((uint)*pfVar11);
          }
          else {
            fVar20 = *pfVar11;
            auVar21 = ZEXT416((uint)fVar20);
            auVar22 = auVar21;
          }
          auVar2 = vmaxss_avx(auVar21,ZEXT416((uint)fVar20));
          auVar2 = vmaxss_avx(auVar22,auVar2);
          fVar23 = auVar2._0_4_;
          if (1e-32 <= fVar23) {
            local_188 = (void *)CONCAT44(local_188._4_4_,fVar20);
            local_190 = (void *)CONCAT44(local_190._4_4_,auVar21._0_4_);
            local_180 = CONCAT44(local_180._4_4_,auVar22._0_4_);
            local_198 = fVar23;
            fVar20 = frexpf(fVar23,(int *)local_154);
            fVar20 = (fVar20 * 256.0) / local_198;
            cVar4 = local_154[0] + -0x80;
            uVar7 = (undefined1)(int)(fVar20 * (float)local_180);
            uVar6 = (undefined1)(int)(fVar20 * local_190._0_4_);
            uVar15 = (undefined1)(int)(fVar20 * local_188._0_4_);
          }
          else {
            uVar6 = 0;
            uVar7 = 0;
            cVar4 = '\0';
            uVar15 = 0;
          }
          *(undefined1 *)((long)pvVar16 + lVar19) = uVar7;
          pfVar11 = (float *)((long)pfVar11 + local_148);
          *(undefined1 *)(local_120 + lVar19) = uVar6;
          *(undefined1 *)(local_118 + lVar19) = uVar15;
          *(char *)(local_110 + lVar19) = cVar4;
          lVar19 = lVar19 + 1;
        } while (local_128 + lVar19 != 0);
        (*s->func)(s->context,&local_194,4);
        lVar19 = 0;
        pvVar17 = pvVar16;
        do {
          pvVar17 = (void *)(lVar19 * uVar12 + (long)pvVar17);
          iVar5 = 0;
          uVar10 = local_178;
          local_190 = pvVar16;
          local_188 = pvVar17;
          local_180 = lVar19;
          do {
            if (iVar5 + 2 < (int)uVar10) {
              uVar18 = (long)iVar5 + 2;
              iVar8 = iVar5;
              cVar4 = *(char *)((long)pvVar17 + (long)iVar5);
              do {
                cVar1 = *(char *)((long)local_190 + (uVar18 - 1));
                if ((cVar4 == cVar1) &&
                   (uVar10 = local_178, cVar4 == *(char *)((long)local_190 + uVar18)))
                goto joined_r0x00161c40;
                uVar18 = uVar18 + 1;
                iVar8 = iVar8 + 1;
                cVar4 = cVar1;
              } while (uVar12 != uVar18);
            }
            iVar8 = (int)uVar12;
            uVar10 = local_178;
joined_r0x00161c40:
            for (; local_178 = uVar10, iVar5 < iVar8; iVar5 = iVar5 + iVar14) {
              iVar14 = iVar8 - iVar5;
              if (0x7f < iVar14) {
                iVar14 = 0x80;
              }
              local_19d = (undefined1)iVar14;
              (*s->func)(s->context,&local_19d,1);
              (*s->func)(s->context,(void *)((long)pvVar17 + (long)iVar5),iVar14);
              pvVar17 = local_188;
              uVar10 = local_178;
            }
            iVar14 = (int)uVar10;
            if (iVar8 + 2 < iVar14) {
              lVar19 = (long)iVar8;
              uVar12 = (ulong)(iVar8 + 1U);
              if ((int)(iVar8 + 1U) < iVar14) {
                uVar12 = uVar10 & 0xffffffff;
              }
              do {
                iVar8 = (int)uVar12;
                if (*(char *)((long)local_190 + lVar19) != *(char *)((long)pvVar17 + (long)iVar5)) {
                  iVar8 = (int)lVar19;
                  break;
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < (long)local_140);
              if (iVar5 < iVar8) {
                do {
                  iVar3 = iVar8 - iVar5;
                  if (0x7e < iVar8 - iVar5) {
                    iVar3 = 0x7f;
                  }
                  local_19d = *(undefined1 *)((long)pvVar17 + (long)iVar5);
                  local_199 = (char)iVar3 + -0x80;
                  (*s->func)(s->context,&local_199,1);
                  (*s->func)(s->context,&local_19d,1);
                  iVar5 = iVar5 + iVar3;
                  pvVar17 = local_188;
                } while (iVar5 < iVar8);
              }
            }
            uVar12 = local_140;
          } while (iVar5 < iVar14);
          pvVar16 = (void *)((long)local_190 + local_140);
          lVar19 = local_180 + 1;
          pvVar17 = local_150;
          uVar13 = local_15c;
        } while (lVar19 != 4);
      }
      uVar9 = (int)local_130 + 1;
      uVar10 = (ulong)uVar9;
      pvVar16 = pvVar17;
    } while (uVar9 != local_160);
    free(pvVar17);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_WANT_SECURE_LIB__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}